

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.h
# Opt level: O2

void __thiscall vmgram_tok_info::~vmgram_tok_info(vmgram_tok_info *this)

{
  long lStack_8;
  
  if (this->typ == '\x03') {
    lStack_8 = 8;
  }
  else {
    if (this->typ != '\x06') {
      return;
    }
    lStack_8 = 0x10;
  }
  free(*(void **)((long)&this->prop + lStack_8));
  return;
}

Assistant:

~vmgram_tok_info()
    {
        switch (typ)
        {
        case VMGRAM_MATCH_LITERAL:
            t3free(typinfo.lit.str);
            break;

        case VMGRAM_MATCH_NSPEECH:
            t3free(typinfo.nspeech.props);
            break;
        }
    }